

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxas.cpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
nxas::assemble(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              string *code,char *filename)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr___00;
  bool bVar1;
  uint *puVar2;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  span<const_unsigned_long,_18446744073709551615UL> code_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blob;
  uint64_t sched;
  vector<opcode,_std::allocator<opcode>_> opcodes;
  context ctx;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_158;
  unsigned_long local_140;
  vector<opcode,_std::allocator<opcode>_> local_138;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_120;
  context local_118;
  
  context::context(&local_118,filename,(code->_M_dataplus)._M_p);
  if (code->_M_string_length == 0) {
    uVar6 = 0;
  }
  else {
    sVar4 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + ((code->_M_dataplus)._M_p[sVar4] == ';');
      sVar4 = sVar4 + 1;
    } while (code->_M_string_length != sVar4);
  }
  std::vector<opcode,_std::allocator<opcode>_>::vector
            (&local_138,uVar6 + 1,(allocator_type *)&local_158);
  uVar8 = 0xffffffffffffffff;
  lVar9 = 0;
  do {
    bVar1 = parse_instruction(&local_118,
                              (opcode *)
                              ((long)&(local_138.super__Vector_base<opcode,_std::allocator<opcode>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->value + lVar9));
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x10;
  } while (bVar1);
  if (uVar6 != uVar8) {
    __assert_fail("index == max_decode_instructions",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/nxas.cpp"
                  ,0x28,"std::vector<uint64_t> nxas::assemble(const std::string &, const char *)");
  }
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_158,((uVar6 + 1) * 4) / 3 + 4);
  local_120 = __return_storage_ptr__;
  if (uVar8 != 0) {
    lVar9 = 0xc;
    uVar6 = 0;
    do {
      if (uVar6 * -0x5555555555555555 < 0x5555555555555556) {
        puVar2 = (uint *)((long)&(local_138.super__Vector_base<opcode,_std::allocator<opcode>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->value + lVar9);
        lVar3 = 0;
        local_140 = 0;
        uVar5 = uVar6;
        do {
          uVar7 = 0x7e0;
          if (uVar5 < uVar8) {
            uVar7 = (ulong)puVar2[-1] << 0x11 | (ulong)*puVar2;
          }
          local_140 = local_140 | uVar7 << ((byte)lVar3 & 0x3f);
          lVar3 = lVar3 + 0x15;
          puVar2 = puVar2 + 4;
          uVar5 = uVar5 + 1;
        } while (lVar3 != 0x3f);
        if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                     (iterator)
                     local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_140);
        }
        else {
          *local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_140;
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                   (iterator)
                   local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   &local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6].value);
      }
      else {
        *local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6].value;
        local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = uVar6 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 != uVar6);
  }
  __return_storage_ptr___00 = local_120;
  uVar6 = (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar6 & 0x18) != 0) {
    do {
      local_140 = 0x50b0000000070f00;
      if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_158,
                   (iterator)
                   local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_140);
      }
      else {
        *local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = 0x50b0000000070f00;
        local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar6 = (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    } while ((uVar6 & 0x18) != 0);
  }
  code_00._M_extent._M_extent_value = (long)uVar6 >> 3;
  code_00._M_ptr =
       local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  context::binary(__return_storage_ptr___00,&local_118,code_00);
  if (local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  context::~context(&local_118);
  return __return_storage_ptr___00;
}

Assistant:

std::vector<uint64_t> assemble(const std::string& code, const char* filename)
{
    // Prepare our context
    context ctx(filename, code.c_str());

    // To determine the number of instructions to allocate we count the number of semicolons this
    // is possible because every instruction ends with a semicolon on the number of decoding
    // instructions we allocate one extra because one instruction might be bugged and it won't have
    // a semicolon (which will trigger a fatal)
    const size_t max_decode_instructions = std::ranges::count(code, ';') + 1;
    std::vector<opcode> opcodes(max_decode_instructions);

    size_t index = 0;
    while (parse_instruction(ctx, opcodes[index++])) {
    }
    assert(index == max_decode_instructions);
    const size_t num_instructions = index - 1;

    std::vector<uint64_t> blob;
    blob.reserve(max_decode_instructions * 4 / 3 + 4);
    for (index = 0; index < num_instructions; ++index) {
        if (index % 3 == 0) {
            uint64_t sched = 0;
            for (size_t address = 0; address < 3; ++address) {
                sched |= generate_sched(opcodes, index, num_instructions, address);
            }
            blob.push_back(sched);
        }
        blob.push_back(opcodes[index].value);
    }
    while (blob.size() % 4) {
        blob.push_back(0x50B0000000070F00ULL);
    }
    return ctx.binary(blob);
}